

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmImportedCxxModuleInfo.cxx
# Opt level: O2

string * __thiscall
ImportedCxxModuleLookup::BmiNameForSource
          (string *__return_storage_ptr__,ImportedCxxModuleLookup *this,string *path)

{
  iterator iVar1;
  iterator iVar2;
  string_view input;
  string_view input_00;
  string safename;
  cmCryptoHash hasher;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleGeneratorInfo>_>_>
          ::find(&(this->GeneratorInfo)._M_t,path);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->GeneratorInfo)._M_t._M_impl.super__Rb_tree_header)
  {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImportedCxxModuleInfo>_>_>
            ::find(&(this->ImportedInfo)._M_t,path);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cmCryptoHash::cmCryptoHash(&hasher,AlgoSHA3_512);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->ImportedInfo)._M_t._M_impl.super__Rb_tree_header
       ) {
      input_00._M_str = (path->_M_dataplus)._M_p;
      input_00._M_len = path->_M_string_length;
      cmCryptoHash::HashString_abi_cxx11_(&safename,&hasher,input_00);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)&safename);
      cmStrCat<std::__cxx11::string,char_const(&)[5]>(&local_48,&local_68,(char (*) [5])".bmi");
    }
    else {
      input._M_str = *(char **)(iVar2._M_node + 2);
      input._M_len = (size_t)iVar2._M_node[2]._M_parent;
      cmCryptoHash::HashString_abi_cxx11_(&safename,&hasher,input);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)&safename);
      cmStrCat<std::__cxx11::string,char_const(&)[5]>(&local_48,&local_68,(char (*) [5])".bmi");
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&safename);
    std::__cxx11::string::string((string *)&safename,(string *)__return_storage_ptr__);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,ImportedCxxModuleGeneratorInfo>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ImportedCxxModuleGeneratorInfo>>>
                *)&this->GeneratorInfo,path,(ImportedCxxModuleGeneratorInfo *)&safename);
    std::__cxx11::string::~string((string *)&safename);
    cmCryptoHash::~cmCryptoHash(&hasher);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(iVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImportedCxxModuleLookup::BmiNameForSource(std::string const& path)
{
  auto genit = this->GeneratorInfo.find(path);
  if (genit != this->GeneratorInfo.end()) {
    return genit->second.BmiName;
  }

  auto importit = this->ImportedInfo.find(path);
  std::string bmiName;
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_512);
  constexpr size_t HASH_TRUNCATION = 12;
  if (importit != this->ImportedInfo.end()) {
    auto safename = hasher.HashString(importit->second.Name);
    bmiName = cmStrCat(safename.substr(0, HASH_TRUNCATION), ".bmi");
  } else {
    auto dirhash = hasher.HashString(path);
    bmiName = cmStrCat(dirhash.substr(0, HASH_TRUNCATION), ".bmi");
  }

  this->GeneratorInfo.emplace(path, ImportedCxxModuleGeneratorInfo{ bmiName });
  return bmiName;
}